

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool parse_args(char ***argv,path *input,path *output,DataInfo *data,ConfigInfo *conf,
               Options *options)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  char *pcVar4;
  path *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  optional<uint32_t> *this;
  pointer pcVar6;
  size_t sStack_5e0;
  bool flag;
  int32_t temp_i32;
  ConfigInfo *local_5d0;
  optional<uint8_t> *local_5c8;
  DataInfo *local_5c0;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_5b8;
  optional<uint32_t> *local_5b0;
  optional<uint32_t> *local_5a8;
  optional<uint32_t> *local_5a0;
  uint32_t *local_598;
  int32_t *local_590;
  string *local_588;
  vector<std::experimental::filesystem::v1::__cxx11::path,std::allocator<std::experimental::filesystem::v1::__cxx11::path>>
  *local_580;
  value_type *it;
  size_t local_570;
  char *o;
  char **argv2;
  optional<std::string> opt_cmdline;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  path local_488;
  small_vector<char_*,_128> args;
  
  local_580 = (vector<std::experimental::filesystem::v1::__cxx11::path,std::allocator<std::experimental::filesystem::v1::__cxx11::path>>
               *)&conf->add_config_files;
  local_588 = &data->levelfile;
  local_590 = &options->timer_index;
  local_598 = &options->local_var_limit;
  local_5a0 = &options->mission_var_limit;
  local_5a8 = &options->switch_case_limit;
  local_5b0 = &options->array_elem_limit;
  local_5c8 = &options->cleo;
  local_5b8 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
               *)&options->defines;
  local_5d0 = conf;
  local_5c0 = data;
LAB_001a3a1b:
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                pcVar4 = **argv;
                if (pcVar4 == (char *)0x0) {
                  return true;
                }
                if (*pcVar4 == '-') break;
                if ((input->_M_pathname)._M_string_length != 0) {
                  pcVar4 = "gta3sc: error: input file appears twice\n";
                  sStack_5e0 = 0x28;
                  goto LAB_001a4693;
                }
                std::experimental::filesystem::v1::__cxx11::path::operator=(input,*argv);
                *argv = *argv + 1;
              }
              pcVar4 = optget(argv,"-h","--help",0);
              if (pcVar4 != (char *)0x0) {
                options->help = true;
                return true;
              }
              pcVar4 = optget(argv,(char *)0x0,"--version",0);
              if (pcVar4 != (char *)0x0) {
                options->version = true;
                return true;
              }
              o = optget(argv,"-o",(char *)0x0,1);
              if (o == (char *)0x0) break;
              std::experimental::filesystem::v1::__cxx11::path::operator=(output,&o);
            }
            pcVar4 = optget(argv,(char *)0x0,"-pedantic-errors",0);
            if (pcVar4 == (char *)0x0) break;
            options->pedantic = true;
            options->pedantic_errors = true;
          }
          pcVar4 = optget(argv,(char *)0x0,"-pedantic",0);
          if (pcVar4 == (char *)0x0) break;
          options->pedantic = true;
        }
        pcVar4 = optget(argv,(char *)0x0,"--guesser",0);
        if (pcVar4 == (char *)0x0) break;
        options->guesser = true;
      }
      pcVar4 = optget(argv,(char *)0x0,"--expect-var",1);
      if (pcVar4 == (char *)0x0) break;
      args.super_SmallVectorImpl<char_*>.super_SmallVectorTemplateBase<char_*,_true>.
      super_SmallVectorTemplateCommon<char_*,_void>.super_SmallVectorBase.BeginX = pcVar4;
      args.super_SmallVectorImpl<char_*>.super_SmallVectorTemplateBase<char_*,_true>.
      super_SmallVectorTemplateCommon<char_*,_void>.super_SmallVectorBase.EndX =
           (void *)strlen(pcVar4);
      bVar1 = Options::push_expect_var(options,(string_view *)&args);
      if (!bVar1) {
        pcVar4 = "gta3sc: error: failed to parse --expect-var entry\n";
        sStack_5e0 = 0x32;
LAB_001a4693:
        fwrite(pcVar4,sStack_5e0,1,_stderr);
        return false;
      }
    }
    pcVar4 = optget(argv,(char *)0x0,"--recursive-traversal",0);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = optget(argv,(char *)0x0,"--config",1);
      if (pcVar4 == (char *)0x0) {
        it = optget(argv,(char *)0x0,"--add-config",1);
        if (it == (char *)0x0) {
          argv2 = (char **)optget(argv,(char *)0x0,"--datadir",1);
          if (argv2 == (char **)0x0) {
            pcVar4 = optget(argv,(char *)0x0,"--levelfile",1);
            if (pcVar4 == (char *)0x0) {
              pcVar4 = optget(argv,(char *)0x0,"--error-format",1);
              if (pcVar4 == (char *)0x0) {
                pcVar4 = optget(argv,(char *)0x0,"-mheader",1);
                if (pcVar4 == (char *)0x0) {
                  pcVar4 = optflag(argv,"-mno-header",(bool *)0x0);
                  if (pcVar4 == (char *)0x0) {
                    pcVar4 = optflag(argv,"-moatc",&flag);
                    if (pcVar4 == (char *)0x0) {
                      pcVar4 = optflag(argv,"-mq11.4",&flag);
                      if (pcVar4 == (char *)0x0) {
                        pcVar4 = optflag(argv,"-mtyped-text-label",&flag);
                        if (pcVar4 == (char *)0x0) {
                          pcVar4 = optflag(argv,"-moptimize-andor",&flag);
                          if (pcVar4 == (char *)0x0) {
                            pcVar4 = optflag(argv,"-moptimize-zero",&flag);
                            if (pcVar4 == (char *)0x0) {
                              pcVar4 = optget(argv,(char *)0x0,"-O",0);
                              if (pcVar4 == (char *)0x0) {
                                pcVar4 = optflag(argv,"-fentity-tracking",&flag);
                                if (pcVar4 == (char *)0x0) {
                                  pcVar4 = optflag(argv,"-fscript-name-check",&flag);
                                  if (pcVar4 == (char *)0x0) {
                                    pcVar4 = optflag(argv,"-frelax-not",&flag);
                                    if (pcVar4 == (char *)0x0) {
                                      pcVar4 = optflag(argv,"-fswitch",&flag);
                                      if (pcVar4 == (char *)0x0) {
                                        pcVar4 = optflag(argv,"-fbreak-continue",(bool *)0x0);
                                        if (pcVar4 == (char *)0x0) {
                                          pcVar4 = optflag(argv,"-fscope-then-label",&flag);
                                          if (pcVar4 == (char *)0x0) {
                                            pcVar4 = optflag(argv,"-funderscore-idents",&flag);
                                            if (pcVar4 == (char *)0x0) {
                                              pcVar4 = optflag(argv,"-farrays",&flag);
                                              if (pcVar4 == (char *)0x0) {
                                                pcVar4 = optflag(argv,"-fconst",&flag);
                                                if (pcVar4 == (char *)0x0) {
                                                  pcVar4 = optflag(argv,"-fstreamed-scripts",&flag);
                                                  if (pcVar4 == (char *)0x0) {
                                                    pcVar4 = optflag(argv,"-ftext-label-vars",&flag)
                                                    ;
                                                    if (pcVar4 == (char *)0x0) {
                                                      pcVar4 = optflag(argv,"-fskip-cutscene",&flag)
                                                      ;
                                                      if (pcVar4 == (char *)0x0) {
                                                        pcVar4 = optflag(argv,"-mlocal-offsets",
                                                                         (bool *)0x0);
                                                        if (pcVar4 == (char *)0x0) {
                                                          pcVar4 = optint<int>(argv,"-ftimer-index",
                                                                               local_590,10);
                                                          if ((pcVar4 == (char *)0x0) &&
                                                             (pcVar4 = optint<unsigned_int>
                                                                                 (argv,
                                                  "-flocal-var-limit",local_598,10),
                                                  pcVar4 == (char *)0x0)) {
                                                    pcVar4 = optint<int>(argv,"-fmission-var-limit",
                                                                         &temp_i32,10);
                                                    if (pcVar4 == (char *)0x0) {
                                                      pcVar4 = optint<int>(argv,
                                                  "-fmission-var-begin",&temp_i32,10);
                                                  if (pcVar4 != (char *)0x0) {
                                                    uVar3 = temp_i32;
                                                    if (temp_i32 < 1) {
                                                      uVar3 = 0;
                                                    }
                                                    options->mission_var_begin = uVar3;
                                                    goto LAB_001a3a1b;
                                                  }
                                                  pcVar4 = optint<int>(argv,"-fswitch-case-limit",
                                                                       &temp_i32,10);
                                                  if (pcVar4 == (char *)0x0) {
                                                    pcVar4 = optint<int>(argv,"-farray-elem-limit",
                                                                         &temp_i32,10);
                                                    if (pcVar4 == (char *)0x0) {
                                                      pcVar4 = optflag(argv,"-fsyntax-only",
                                                                       (bool *)0x0);
                                                      if (pcVar4 == (char *)0x0) {
                                                        pcVar4 = optflag(argv,"-emit-ir2",
                                                                         (bool *)0x0);
                                                        if (pcVar4 == (char *)0x0) {
                                                          pcVar4 = optflag(argv,"-fcleo",(bool *)0x0
                                                                          );
                                                          if (pcVar4 != (char *)0x0) {
                                                            args.super_SmallVectorImpl<char_*>.
                                                                                                                        
                                                  super_SmallVectorTemplateBase<char_*,_true>.
                                                  super_SmallVectorTemplateCommon<char_*,_void>.
                                                  super_SmallVectorBase.BeginX =
                                                       (void *)((ulong)args.
                                                  super_SmallVectorImpl<char_*>.
                                                  super_SmallVectorTemplateBase<char_*,_true>.
                                                  super_SmallVectorTemplateCommon<char_*,_void>.
                                                  super_SmallVectorBase.BeginX & 0xffffffff00000000)
                                                  ;
                                                  std::experimental::optional<unsigned_char>::
                                                  emplace<int>(local_5c8,(int *)&args);
                                                  goto LAB_001a3a1b;
                                                  }
                                                  pcVar4 = optget(argv,(char *)0x0,"--cs",0);
                                                  if (pcVar4 == (char *)0x0) {
                                                    pcVar4 = optget(argv,(char *)0x0,"--cm",0);
                                                    if (pcVar4 == (char *)0x0) {
                                                      pcVar4 = optflag(argv,"-fmission-script",
                                                                       (bool *)0x0);
                                                      if (pcVar4 == (char *)0x0) {
                                                        pcVar4 = optflag(argv,"-Werror",&flag);
                                                        if (pcVar4 == (char *)0x0) {
                                                          pcVar4 = optflag(argv,
                                                  "-Wconflict-text-label-var",&flag);
                                                  if (pcVar4 == (char *)0x0) {
                                                    pcVar4 = optflag(argv,"-Wexpect-var",&flag);
                                                    if (pcVar4 == (char *)0x0) {
                                                      pcVar4 = optflag(argv,"-fconstant-checks",
                                                                       &flag);
                                                      if (pcVar4 == (char *)0x0) {
                                                        pcVar4 = optget(argv,"-D","--define",1);
                                                        if (pcVar4 == (char *)0x0) {
                                                          pcVar4 = optget(argv,"-U","--undefine",1);
                                                          if (pcVar4 == (char *)0x0) {
                                                            fprintf(_stderr,
                                                  "gta3sc: error: unregonized argument \'%s\'\n",
                                                  **argv);
                                                  return false;
                                                  }
                                                  args.super_SmallVectorImpl<char_*>.
                                                  super_SmallVectorTemplateBase<char_*,_true>.
                                                  super_SmallVectorTemplateCommon<char_*,_void>.
                                                  super_SmallVectorBase.BeginX = pcVar4;
                                                  args.super_SmallVectorImpl<char_*>.
                                                  super_SmallVectorTemplateBase<char_*,_true>.
                                                  super_SmallVectorTemplateCommon<char_*,_void>.
                                                  super_SmallVectorBase.EndX =
                                                       (void *)strlen(pcVar4);
                                                  Options::undefine(options,(string_view *)&args);
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_4a8,pcVar4,
                                                               (allocator<char> *)&args);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_4c8,"1",
                                                               (allocator<char> *)&local_488);
                                                    std::
                                                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                                  ::
                                                  _M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
                                                            (local_5b8,&local_4a8,&local_4c8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_4c8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_4a8);
                                                  }
                                                  }
                                                  else {
                                                    options->constant_checks = flag;
                                                  }
                                                  }
                                                  else {
                                                    options->warn_expect_var = flag;
                                                  }
                                                  }
                                                  else {
                                                    options->warn_conflict_text_label_var = flag;
                                                  }
                                                  }
                                                  else {
                                                    options->warning_is_error = flag;
                                                  }
                                                  }
                                                  else {
                                                    options->mission_script = true;
                                                  }
                                                  goto LAB_001a3a1b;
                                                  }
                                                  args.super_SmallVectorImpl<char_*>.
                                                  super_SmallVectorTemplateBase<char_*,_true>.
                                                  super_SmallVectorTemplateCommon<char_*,_void>.
                                                  super_SmallVectorBase.BeginX =
                                                       (void *)((ulong)args.
                                                  super_SmallVectorImpl<char_*>.
                                                  super_SmallVectorTemplateBase<char_*,_true>.
                                                  super_SmallVectorTemplateCommon<char_*,_void>.
                                                  super_SmallVectorBase.BeginX & 0xffffffff00000000)
                                                  ;
                                                  std::experimental::optional<unsigned_char>::
                                                  emplace<int>(local_5c8,(int *)&args);
                                                  options->output_cleo = true;
                                                  options->mission_script = true;
                                                  }
                                                  else {
                                                    args.super_SmallVectorImpl<char_*>.
                                                    super_SmallVectorTemplateBase<char_*,_true>.
                                                    super_SmallVectorTemplateCommon<char_*,_void>.
                                                    super_SmallVectorBase.BeginX =
                                                         (void *)((ulong)args.
                                                  super_SmallVectorImpl<char_*>.
                                                  super_SmallVectorTemplateBase<char_*,_true>.
                                                  super_SmallVectorTemplateCommon<char_*,_void>.
                                                  super_SmallVectorBase.BeginX & 0xffffffff00000000)
                                                  ;
                                                  std::experimental::optional<unsigned_char>::
                                                  emplace<int>(local_5c8,(int *)&args);
                                                  options->output_cleo = true;
                                                  options->mission_script = false;
                                                  }
                                                  options->headerless = true;
                                                  options->use_local_offsets = true;
                                                  goto LAB_001a3a1b;
                                                  }
                                                  options->emit_ir2 = true;
                                                  }
                                                  else {
                                                    options->fsyntax_only = true;
                                                  }
                                                  goto LAB_001a3a1b;
                                                  }
                                                  if (temp_i32 < 0) {
                                                    args.super_SmallVectorImpl<char_*>.
                                                    super_SmallVectorTemplateBase<char_*,_true>.
                                                    super_SmallVectorTemplateCommon<char_*,_void>.
                                                    super_SmallVectorBase.BeginX._0_5_ =
                                                         CONCAT14(0,(uint)args.
                                                  super_SmallVectorImpl<char_*>.
                                                  super_SmallVectorTemplateBase<char_*,_true>.
                                                  super_SmallVectorTemplateCommon<char_*,_void>.
                                                  super_SmallVectorBase.BeginX);
                                                  }
                                                  else {
                                                    args.super_SmallVectorImpl<char_*>.
                                                    super_SmallVectorTemplateBase<char_*,_true>.
                                                    super_SmallVectorTemplateCommon<char_*,_void>.
                                                    super_SmallVectorBase.BeginX =
                                                         (void *)CONCAT44(temp_i32,(uint)args.
                                                  super_SmallVectorImpl<char_*>.
                                                  super_SmallVectorTemplateBase<char_*,_true>.
                                                  super_SmallVectorTemplateCommon<char_*,_void>.
                                                  super_SmallVectorBase.BeginX);
                                                  }
                                                  args.super_SmallVectorImpl<char_*>.
                                                  super_SmallVectorTemplateBase<char_*,_true>.
                                                  super_SmallVectorTemplateCommon<char_*,_void>.
                                                  super_SmallVectorBase.BeginX =
                                                       (void *)CONCAT71(args.
                                                  super_SmallVectorImpl<char_*>.
                                                  super_SmallVectorTemplateBase<char_*,_true>.
                                                  super_SmallVectorTemplateCommon<char_*,_void>.
                                                  super_SmallVectorBase.BeginX._1_7_,temp_i32 >= 0);
                                                  this = local_5b0;
                                                  }
                                                  else {
                                                    if (temp_i32 < 0) {
                                                      args.super_SmallVectorImpl<char_*>.
                                                      super_SmallVectorTemplateBase<char_*,_true>.
                                                      super_SmallVectorTemplateCommon<char_*,_void>.
                                                      super_SmallVectorBase.BeginX._0_5_ =
                                                           CONCAT14(0,(uint)args.
                                                  super_SmallVectorImpl<char_*>.
                                                  super_SmallVectorTemplateBase<char_*,_true>.
                                                  super_SmallVectorTemplateCommon<char_*,_void>.
                                                  super_SmallVectorBase.BeginX);
                                                  }
                                                  else {
                                                    args.super_SmallVectorImpl<char_*>.
                                                    super_SmallVectorTemplateBase<char_*,_true>.
                                                    super_SmallVectorTemplateCommon<char_*,_void>.
                                                    super_SmallVectorBase.BeginX =
                                                         (void *)CONCAT44(temp_i32,(uint)args.
                                                  super_SmallVectorImpl<char_*>.
                                                  super_SmallVectorTemplateBase<char_*,_true>.
                                                  super_SmallVectorTemplateCommon<char_*,_void>.
                                                  super_SmallVectorBase.BeginX);
                                                  }
                                                  args.super_SmallVectorImpl<char_*>.
                                                  super_SmallVectorTemplateBase<char_*,_true>.
                                                  super_SmallVectorTemplateCommon<char_*,_void>.
                                                  super_SmallVectorBase.BeginX =
                                                       (void *)CONCAT71(args.
                                                  super_SmallVectorImpl<char_*>.
                                                  super_SmallVectorTemplateBase<char_*,_true>.
                                                  super_SmallVectorTemplateCommon<char_*,_void>.
                                                  super_SmallVectorBase.BeginX._1_7_,temp_i32 >= 0);
                                                  this = local_5a8;
                                                  }
                                                  }
                                                  else {
                                                    if (temp_i32 < 0) {
                                                      args.super_SmallVectorImpl<char_*>.
                                                      super_SmallVectorTemplateBase<char_*,_true>.
                                                      super_SmallVectorTemplateCommon<char_*,_void>.
                                                      super_SmallVectorBase.BeginX._0_5_ =
                                                           CONCAT14(0,(uint)args.
                                                  super_SmallVectorImpl<char_*>.
                                                  super_SmallVectorTemplateBase<char_*,_true>.
                                                  super_SmallVectorTemplateCommon<char_*,_void>.
                                                  super_SmallVectorBase.BeginX);
                                                  }
                                                  else {
                                                    args.super_SmallVectorImpl<char_*>.
                                                    super_SmallVectorTemplateBase<char_*,_true>.
                                                    super_SmallVectorTemplateCommon<char_*,_void>.
                                                    super_SmallVectorBase.BeginX =
                                                         (void *)CONCAT44(temp_i32,(uint)args.
                                                  super_SmallVectorImpl<char_*>.
                                                  super_SmallVectorTemplateBase<char_*,_true>.
                                                  super_SmallVectorTemplateCommon<char_*,_void>.
                                                  super_SmallVectorBase.BeginX);
                                                  }
                                                  args.super_SmallVectorImpl<char_*>.
                                                  super_SmallVectorTemplateBase<char_*,_true>.
                                                  super_SmallVectorTemplateCommon<char_*,_void>.
                                                  super_SmallVectorBase.BeginX =
                                                       (void *)CONCAT71(args.
                                                  super_SmallVectorImpl<char_*>.
                                                  super_SmallVectorTemplateBase<char_*,_true>.
                                                  super_SmallVectorTemplateCommon<char_*,_void>.
                                                  super_SmallVectorBase.BeginX._1_7_,temp_i32 >= 0);
                                                  this = local_5a0;
                                                  }
                                                  std::experimental::optional<unsigned_int>::
                                                  operator=(this,(optional<unsigned_int> *)&args);
                                                  }
                                                  }
                                                  else {
                                                    options->use_local_offsets = true;
                                                  }
                                                  }
                                                  else {
                                                    options->skip_cutscene = flag;
                                                  }
                                                  }
                                                  else {
                                                    options->text_label_vars = flag;
                                                  }
                                                  }
                                                  else {
                                                    options->streamed_scripts = flag;
                                                  }
                                                }
                                                else {
                                                  options->fconst = flag;
                                                }
                                              }
                                              else {
                                                options->farrays = flag;
                                              }
                                            }
                                            else {
                                              options->allow_underscore_identifiers = flag;
                                            }
                                          }
                                          else {
                                            options->scope_then_label = flag;
                                          }
                                        }
                                        else {
                                          options->allow_break_continue = true;
                                        }
                                      }
                                      else {
                                        options->fswitch = flag;
                                      }
                                    }
                                    else {
                                      options->relax_not = flag;
                                    }
                                  }
                                  else {
                                    options->script_name_check = flag;
                                  }
                                }
                                else {
                                  options->entity_tracking = flag;
                                }
                              }
                              else {
                                options->optimize_andor = true;
                                options->optimize_zero_floats = true;
                              }
                            }
                            else {
                              options->optimize_zero_floats = flag;
                            }
                          }
                          else {
                            options->optimize_andor = flag;
                          }
                        }
                        else {
                          options->has_text_label_prefix = flag;
                        }
                      }
                      else {
                        options->use_half_float = flag;
                      }
                    }
                    else {
                      options->oatc = flag;
                    }
                  }
                  else {
                    options->headerless = true;
                  }
                }
                else {
                  iVar2 = strcmp(pcVar4,"gta3");
                  if (iVar2 == 0) {
                    options->header = GTA3;
                  }
                  else {
                    iVar2 = strcmp(pcVar4,"gtavc");
                    if (iVar2 == 0) {
                      options->header = GTAVC;
                    }
                    else {
                      iVar2 = strcmp(pcVar4,"gtasa");
                      if (iVar2 != 0) {
                        pcVar4 = 
                        "gta3sc: error: invalid header version, must be \'gta3\', \'gtavc\' or \'gtasa\'\n"
                        ;
                        sStack_5e0 = 0x4a;
                        goto LAB_001a4693;
                      }
                      options->header = GTASA;
                    }
                  }
                }
              }
              else {
                iVar2 = strcmp(pcVar4,"default");
                if (iVar2 == 0) {
                  options->error_format = Default;
                }
                else {
                  iVar2 = strcmp(pcVar4,"json");
                  if (iVar2 != 0) {
                    pcVar4 = "gta3sc: error: invalid error-format\n";
                    sStack_5e0 = 0x24;
                    goto LAB_001a4693;
                  }
                  options->error_format = JSON;
                }
              }
            }
            else {
              std::__cxx11::string::assign((char *)local_588);
            }
          }
          else {
            std::experimental::filesystem::v1::__cxx11::path::operator=
                      (&local_5c0->datadir,(char **)&argv2);
          }
        }
        else {
          std::
          vector<std::experimental::filesystem::v1::__cxx11::path,std::allocator<std::experimental::filesystem::v1::__cxx11::path>>
          ::emplace_back<char_const*&>(local_580,&it);
        }
      }
      else {
        args.super_SmallVectorImpl<char_*>.super_SmallVectorTemplateBase<char_*,_true>.
        super_SmallVectorTemplateCommon<char_*,_void>.super_SmallVectorBase.BeginX =
             (local_5d0->config_name)._M_dataplus._M_p;
        args.super_SmallVectorImpl<char_*>.super_SmallVectorTemplateBase<char_*,_true>.
        super_SmallVectorTemplateCommon<char_*,_void>.super_SmallVectorBase.EndX =
             (void *)(local_5d0->config_name)._M_string_length;
        it = pcVar4;
        local_570 = strlen(pcVar4);
        bVar1 = iequal_to::operator()((iequal_to *)&argv2,(string_view *)&args,(string_view *)&it);
        if (!bVar1) {
          std::__cxx11::string::assign((char *)local_5d0);
          __lhs = config_path_abi_cxx11_();
          std::experimental::filesystem::v1::__cxx11::path::
          path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
                    ((path *)&argv2,&local_5d0->config_name);
          std::experimental::filesystem::v1::__cxx11::operator/((path *)&it,__lhs,(path *)&argv2);
          std::experimental::filesystem::v1::__cxx11::path::
          path<char[16],std::experimental::filesystem::v1::__cxx11::path>
                    (&local_488,(char (*) [16])"commandline.txt");
          std::experimental::filesystem::v1::__cxx11::operator/
                    ((path *)&args,(path *)&it,&local_488);
          read_file_utf8(&opt_cmdline,(path *)&args);
          std::experimental::filesystem::v1::__cxx11::path::~path((path *)&args);
          std::experimental::filesystem::v1::__cxx11::path::~path(&local_488);
          std::experimental::filesystem::v1::__cxx11::path::~path((path *)&it);
          std::experimental::filesystem::v1::__cxx11::path::~path((path *)&argv2);
          if (opt_cmdline.super_OptionalBase<std::__cxx11::basic_string<char>_>.init_ != true) {
            fwrite("gta3sc: error: config path is missing commandline.txt file\n",0x3b,1,_stderr);
            std::experimental::
            optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~optional_base(&opt_cmdline.super_OptionalBase<std::__cxx11::basic_string<char>_>);
            return false;
          }
          pbVar5 = std::experimental::
                   optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&opt_cmdline);
          args.super_SmallVectorImpl<char_*>.super_SmallVectorTemplateBase<char_*,_true>.
          super_SmallVectorTemplateCommon<char_*,_void>.super_SmallVectorBase.BeginX =
               &args.super_SmallVectorImpl<char_*>.super_SmallVectorTemplateBase<char_*,_true>.
                super_SmallVectorTemplateCommon<char_*,_void>.FirstEl;
          args.super_SmallVectorImpl<char_*>.super_SmallVectorTemplateBase<char_*,_true>.
          super_SmallVectorTemplateCommon<char_*,_void>.super_SmallVectorBase.CapacityX =
               &stack0xffffffffffffffd0;
          pcVar6 = (pointer)pbVar5->_M_string_length;
          it = pcVar6;
          if (pcVar6 != (pointer)0x0) {
            it = (pbVar5->_M_dataplus)._M_p;
          }
          pcVar6 = pcVar6 + (long)it;
          args.super_SmallVectorImpl<char_*>.super_SmallVectorTemplateBase<char_*,_true>.
          super_SmallVectorTemplateCommon<char_*,_void>.super_SmallVectorBase.EndX =
               args.super_SmallVectorImpl<char_*>.super_SmallVectorTemplateBase<char_*,_true>.
               super_SmallVectorTemplateCommon<char_*,_void>.super_SmallVectorBase.BeginX;
          while (it != pcVar6) {
            it = std::__find_if<char*,__gnu_cxx::__ops::_Iter_negate<int(*)(int)noexcept>>
                           (it,pcVar6,isspace);
            llvm_vecsmall::SmallVectorImpl<char*>::emplace_back<char*&>
                      ((SmallVectorImpl<char*> *)&args,&it);
            pcVar4 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_pred<int(*)(int)noexcept>>
                               (it,pcVar6,isspace);
            it = pcVar4;
            if (pcVar4 != pcVar6) {
              it = pcVar4 + 1;
              *pcVar4 = '\0';
            }
          }
          argv2 = (char **)0x0;
          llvm_vecsmall::SmallVectorImpl<char*>::emplace_back<decltype(nullptr)>
                    ((SmallVectorImpl<char*> *)&args,&argv2);
          argv2 = (char **)args.super_SmallVectorImpl<char_*>.
                           super_SmallVectorTemplateBase<char_*,_true>.
                           super_SmallVectorTemplateCommon<char_*,_void>.super_SmallVectorBase.
                           BeginX;
          bVar1 = parse_args(&argv2,input,output,local_5c0,local_5d0,options);
          llvm_vecsmall::SmallVectorImpl<char_*>::~SmallVectorImpl
                    (&args.super_SmallVectorImpl<char_*>);
          std::experimental::
          optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~optional_base(&opt_cmdline.super_OptionalBase<std::__cxx11::basic_string<char>_>);
          if (!bVar1) {
            return false;
          }
        }
      }
      goto LAB_001a3a1b;
    }
    options->linear_sweep = false;
  } while( true );
}

Assistant:

bool parse_args(char**& argv, fs::path& input, fs::path& output, DataInfo& data, ConfigInfo& conf, Options& options)
{
    try
    {
        bool flag;
        int32_t temp_i32;

        while(*argv)
        {
            if(**argv != '-')
            {
                if(!input.empty())
                {
                    fprintf(stderr, "gta3sc: error: input file appears twice\n");
                    return false;
                }

                input = *argv;
                ++argv;
            }
            else if(optget(argv, "-h", "--help", 0))
            {
                options.help = true;
                return true;
            }
            else if(optget(argv, nullptr, "--version", 0))
            {
                options.version = true;
                return true;
            }
            else if(const char* o = optget(argv, "-o", nullptr, 1))
            {
                output = o;
            }
            else if(optget(argv, nullptr, "-pedantic-errors", 0))
            {
                options.pedantic = true;
                options.pedantic_errors = true;
            }
            else if(optget(argv, nullptr, "-pedantic", 0))
            {
                options.pedantic = true;
            }
            else if(optget(argv, nullptr, "--guesser", 0))
            {
                options.guesser = true;
            }
            else if(const char* info = optget(argv, nullptr, "--expect-var", 1))
            {
                if(!options.push_expect_var(info))
                {
                    fprintf(stderr, "gta3sc: error: failed to parse --expect-var entry\n");
                    return false;
                }
            }
            else if(optget(argv, nullptr, "--recursive-traversal", 0))
            {
                options.linear_sweep = false;
            }
            else if(const char* name = optget(argv, nullptr, "--config", 1))
            {
                // avoid infinite recursion of parse_args(...) calls
                if(iequal_to()(conf.config_name, name))
                    continue;

                conf.config_name = name;

                if(auto opt_cmdline = read_file_utf8(config_path() / conf.config_name / "commandline.txt"))
                {
                    auto& cmdline = *opt_cmdline;
                    small_vector<char*, 128> args;

                    auto it = !cmdline.empty()? &cmdline[0] : nullptr;
                    auto end = it + cmdline.size();
                    for(; it != end; )
                    {
                        it = std::find_if_not(it, end, ::isspace);
                        args.emplace_back(it);
                        it = std::find_if(it, end, ::isspace);
                        if(it != end) *it++ = '\0';
                    }
                    args.emplace_back(nullptr);

                    char** argv2 = args.data();
                    if(!parse_args(argv2, input, output, data, conf, options))
                        return false;
                }
                else
                {
                    fprintf(stderr, "gta3sc: error: config path is missing commandline.txt file\n");
                    return false;
                }
            }
            else if(const char* path = optget(argv, nullptr, "--add-config", 1))
            {
                conf.add_config_files.emplace_back(path);
            }
            else if(const char* path = optget(argv, nullptr, "--datadir", 1))
            {
                data.datadir = path;
            }
            else if(const char* name = optget(argv, nullptr, "--levelfile", 1))
            {
                data.levelfile = name;
            }
            else if(const char* name = optget(argv, nullptr, "--error-format", 1))
            {
                if(!strcmp(name, "default"))
                    options.error_format = Options::ErrorFormat::Default;
                else if(!strcmp(name, "json"))
                    options.error_format = Options::ErrorFormat::JSON;
                else
                {
                    fprintf(stderr, "gta3sc: error: invalid error-format\n");
                    return false;
                }
            }
            else if(const char* ver = optget(argv, nullptr, "-mheader", 1))
            {
                if(!strcmp(ver, "gta3"))
                    options.header = Options::HeaderVersion::GTA3;
                else if(!strcmp(ver, "gtavc"))
                    options.header = Options::HeaderVersion::GTAVC;
                else if(!strcmp(ver, "gtasa"))
                    options.header = Options::HeaderVersion::GTASA;
                else
                {
                    fprintf(stderr, "gta3sc: error: invalid header version, must be 'gta3', 'gtavc' or 'gtasa'\n");
                    return false;
                }
            }
            else if(optflag(argv, "-mno-header", nullptr))
            {
                options.headerless = true;
            }
            else if(optflag(argv, "-moatc", &flag))
            {
                options.oatc = flag;
            }
            else if(optflag(argv, "-mq11.4", &flag))
            {
                options.use_half_float = flag;
            }
            else if(optflag(argv, "-mtyped-text-label", &flag))
            {
                options.has_text_label_prefix = flag;
            }
            else if(optflag(argv, "-moptimize-andor", &flag))
            {
                options.optimize_andor = flag;
            }
            else if(optflag(argv, "-moptimize-zero", &flag))
            {
                options.optimize_zero_floats = flag;
            }
            else if(optget(argv, nullptr, "-O", 0))
            {
                options.optimize_andor = true;
                options.optimize_zero_floats = true;
            }
            else if(optflag(argv, "-fentity-tracking", &flag))
            {
                options.entity_tracking = flag;
            }
            else if(optflag(argv, "-fscript-name-check", &flag))
            {
                options.script_name_check = flag;
            }
            else if(optflag(argv, "-frelax-not", &flag))
            {
                options.relax_not = flag;
            }
            else if(optflag(argv, "-fswitch", &flag))
            {
                options.fswitch = flag;
            }
            else if(optflag(argv, "-fbreak-continue", nullptr))
            {
                options.allow_break_continue = true;
            }
            else if(optflag(argv, "-fscope-then-label", &flag))
            {
                options.scope_then_label = flag;
            }
            else if(optflag(argv, "-funderscore-idents", &flag))
            {
                options.allow_underscore_identifiers = flag;
            }
            else if(optflag(argv, "-farrays", &flag))
            {
                options.farrays = flag;
            }
            else if(optflag(argv, "-fconst", &flag))
            {
                options.fconst = flag;
            }
            else if(optflag(argv, "-fstreamed-scripts", &flag))
            {
                options.streamed_scripts = flag;
            }
            else if(optflag(argv, "-ftext-label-vars", &flag))
            {
                options.text_label_vars = flag;
            }
            else if(optflag(argv, "-fskip-cutscene", &flag))
            {
                options.skip_cutscene = flag;
            }
            else if(optflag(argv, "-mlocal-offsets", nullptr))
            {
                options.use_local_offsets = true;
            }
            else if(optint(argv, "-ftimer-index", &options.timer_index)) {}
            else if(optint(argv, "-flocal-var-limit", &options.local_var_limit)) {}
            else if(optint(argv, "-fmission-var-limit", &temp_i32))
            {
                options.mission_var_limit = temp_i32 < 0? nullopt : optional<uint32_t>(temp_i32);
            }
            else if(optint(argv, "-fmission-var-begin", &temp_i32))
            {
                options.mission_var_begin = std::max(0, temp_i32);
            }
            else if(optint(argv, "-fswitch-case-limit", &temp_i32))
            {
                options.switch_case_limit = temp_i32 < 0? nullopt : optional<uint32_t>(temp_i32);
            }
            else if(optint(argv, "-farray-elem-limit", &temp_i32))
            {
                options.array_elem_limit = temp_i32 < 0? nullopt : optional<uint32_t>(temp_i32);
            }
            else if(optflag(argv, "-fsyntax-only", nullptr))
            {
                options.fsyntax_only = true;
            }
            else if(optflag(argv, "-emit-ir2", nullptr))
            {
                options.emit_ir2 = true;
            }
            else if(optflag(argv, "-fcleo", nullptr))
            {
                options.cleo.emplace(0);
            }
            else if(optget(argv, nullptr, "--cs", 0))
            {
                options.cleo.emplace(0);
                options.output_cleo = true;
                options.mission_script = false;
                options.headerless = true;
                options.use_local_offsets = true;
            }
            else if(optget(argv, nullptr, "--cm", 0))
            {
                options.cleo.emplace(0);
                options.output_cleo = true;
                options.mission_script = true;
                options.headerless = true;
                options.use_local_offsets = true;
            }
            else if(optflag(argv, "-fmission-script", nullptr))
            {
                options.mission_script = true;
            }
            else if(optflag(argv, "-Werror", &flag))
            {
                options.warning_is_error = flag;
            }
            else if(optflag(argv, "-Wconflict-text-label-var", &flag))
            {
                options.warn_conflict_text_label_var = flag;
            }
            else if(optflag(argv, "-Wexpect-var", &flag))
            {
                options.warn_expect_var = flag;
            }
            else if(optflag(argv, "-fconstant-checks", &flag))
            {
                options.constant_checks = flag;
            }
            else if(const char* name = optget(argv, "-D", "--define", 1))
            {
                options.define(name);
            }
            else if(const char* name = optget(argv, "-U", "--undefine", 1))
            {
                options.undefine(name);
            }
            else
            {
                fprintf(stderr, "gta3sc: error: unregonized argument '%s'\n", *argv);
                return false;
            }
        }

        return true;
    }
    catch(const invalid_opt& e)
    {
        fprintf(stderr, "gta3sc: error: %s\n", e.what());
        return false;
    }
}